

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCancellationTest.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_67cc9::intFromValue(ValueType *value)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  size_type sVar4;
  const_reference pvVar5;
  ValueType *value_local;
  
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(value);
  if (sVar4 == 4) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](value,0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](value,1);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](value,2);
    vVar3 = *pvVar5;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](value,3);
    return CONCAT13(*pvVar5,CONCAT12(vVar3,CONCAT11(vVar2,vVar1)));
  }
  __assert_fail("value.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/DepsBuildEngineTest.cpp"
                ,0x42,"int32_t (anonymous namespace)::intFromValue(const core::ValueType &)");
}

Assistant:

static int32_t intFromValue(const core::ValueType& value) {
  assert(value.size() == 4);
  return ((value[0] << 0) |
          (value[1] << 8) |
          (value[2] << 16) |
          (value[3] << 24));
}